

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

bool __thiscall wirehair::Codec::AllocateMatrix(Codec *this)

{
  size_t size;
  uint64_t *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint64_t *__s;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint16_t *puVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar2 = this->_defer_count;
  uVar3 = this->_mix_count;
  uVar4 = this->_extra_count;
  uVar10 = (uint)uVar3 + (uint)uVar2;
  uVar5 = uVar4 + 1 + (uint)this->_dense_count + (uint)uVar2;
  uVar11 = uVar3 + 0x3f + (uint)uVar2 >> 6;
  uVar13 = (ulong)(uVar5 * uVar11);
  uVar14 = (ulong)(this->_block_count * uVar11);
  uVar7 = 0x12;
  if (uVar3 < 0x12) {
    uVar7 = (uint)uVar3;
  }
  uVar6 = uVar7 + 6 & 0x3c;
  uVar8 = uVar6 * (uVar4 + 6);
  size = (ulong)(uVar10 * 2 + (uVar10 + uVar4) * 4 + uVar8) + (uVar13 + uVar14) * 8;
  if (this->_ge_allocated < size) {
    FreeMatrix(this);
    __s = (uint64_t *)SIMDSafeAllocate(size);
    if (__s == (uint64_t *)0x0) {
      return false;
    }
    this->_ge_allocated = size;
    this->_compress_matrix = __s;
    uVar2 = this->_defer_count;
    uVar3 = this->_mix_count;
  }
  else {
    __s = this->_compress_matrix;
  }
  puVar1 = __s + uVar14;
  uVar12 = (ulong)((uVar10 + uVar4) * 2);
  this->_ge_pitch = uVar11;
  puVar9 = (uint16_t *)((ulong)uVar8 + (long)(puVar1 + uVar13));
  this->_ge_rows = uVar5;
  this->_ge_cols = uVar10;
  this->_ge_matrix = puVar1;
  this->_heavy_pitch = uVar6;
  this->_heavy_rows = uVar4 + 6;
  this->_heavy_columns = uVar7;
  this->_first_heavy_column = (uVar2 - uVar7) + (uint)uVar3;
  this->_heavy_matrix = (uint8_t *)(puVar1 + uVar13);
  this->_pivots = puVar9;
  puVar9 = (uint16_t *)((long)puVar9 + uVar12);
  this->_ge_row_map = puVar9;
  this->_ge_col_map = (uint16_t *)((long)puVar9 + uVar12);
  memset(__s,0,uVar14 << 3);
  memset(this->_ge_matrix,0,(ulong)(uVar10 * uVar11 * 8));
  return true;
}

Assistant:

bool Codec::AllocateMatrix()
{
    CAT_IF_DUMP(cout << endl << "---- AllocateMatrix ----" << endl << endl;)

    // GE matrix
    const unsigned ge_cols = _defer_count + _mix_count;
    const unsigned ge_rows = _defer_count + _dense_count + _extra_count + 1; // One extra for workspace
    const unsigned ge_pitch = (ge_cols + 63) / 64;
    const unsigned ge_matrix_words = ge_rows * ge_pitch;

    // Compression matrix
    const unsigned compress_rows = _block_count;
    const unsigned compress_matrix_words = compress_rows * ge_pitch;

    // Pivots
    const unsigned pivot_count = ge_cols + _extra_count;
    const unsigned pivot_words = pivot_count * 2 + ge_cols;

    // Heavy
    const unsigned heavy_rows = kHeavyRows + _extra_count;
    const unsigned heavy_cols = _mix_count < kHeavyCols ? _mix_count : kHeavyCols;
    const unsigned heavy_pitch = (heavy_cols + 3 + 3) & ~3; // Round up columns+3 to next multiple of 4
    const unsigned heavy_bytes = heavy_pitch * heavy_rows;

    // Calculate buffer size
    const uint64_t sizeBytes = \
        compress_matrix_words * sizeof(uint64_t)
        + ge_matrix_words * sizeof(uint64_t)
        + heavy_bytes
        + pivot_words * sizeof(uint16_t);

    // If need to allocate more:
    if (_ge_allocated < sizeBytes)
    {
        FreeMatrix();

        uint8_t * GF256_RESTRICT matrix = SIMDSafeAllocate((size_t)sizeBytes);
        if (!matrix) {
            return false;
        }

        _ge_allocated = sizeBytes;
        _compress_matrix = reinterpret_cast<uint64_t *>( matrix );
    }

    // Store pointers
    _ge_pitch = ge_pitch;
    _ge_rows = ge_rows;
    _ge_cols = ge_cols;
    _ge_matrix = _compress_matrix + compress_matrix_words;
    _heavy_pitch = heavy_pitch;
    _heavy_rows = heavy_rows;
    _heavy_columns = heavy_cols;
    _first_heavy_column = _defer_count + _mix_count - heavy_cols;
    _heavy_matrix = reinterpret_cast<uint8_t *>( _ge_matrix + ge_matrix_words );
    _pivots = reinterpret_cast<uint16_t *>( _heavy_matrix + heavy_bytes );
    _ge_row_map = _pivots + pivot_count;
    _ge_col_map = _ge_row_map + pivot_count;

    CAT_IF_DUMP(cout << "GE matrix is " << ge_rows << " x " << ge_cols
        << " with pitch " << ge_pitch << " consuming "
        << ge_matrix_words * sizeof(uint64_t) << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Compress matrix is " << compress_rows
        << " x " << ge_cols << " with pitch " << ge_pitch
        << " consuming " << compress_matrix_words * sizeof(uint64_t)
        << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Allocated " << pivot_count
        << " pivots, consuming " << pivot_words*2 << " bytes" << endl;)
    CAT_IF_DUMP(cout << "Allocated " << kHeavyRows
        << " heavy rows, consuming " << heavy_bytes << " bytes" << endl;)

    // Clear entire Compression matrix
    memset(_compress_matrix, 0, compress_matrix_words * sizeof(uint64_t));

    // Clear entire GE matrix.
    // This clears ge_cols not ge_rows because we just need to clear the upper
    // square matrix, whereas ge_rows also includes some extra rows for data
    // received in excess of N for when the decoder fails and has to resume
    // again.
    // When these extra rows are added we clear the row memory at that point.
    memset(_ge_matrix, 0, ge_cols * ge_pitch * sizeof(uint64_t));

    return true;
}